

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void cmsysMD5_DigestToHex(uchar *digest,char *buffer)

{
  char *pcVar1;
  int local_24;
  char *pcStack_20;
  int i;
  char *out;
  char *buffer_local;
  uchar *digest_local;
  
  pcStack_20 = buffer;
  for (local_24 = 0; local_24 < 0x10; local_24 = local_24 + 1) {
    pcVar1 = pcStack_20 + 1;
    *pcStack_20 = "0123456789abcdef"[(int)(uint)digest[local_24] >> 4];
    pcStack_20 = pcStack_20 + 2;
    *pcVar1 = "0123456789abcdef"[(int)(digest[local_24] & 0xf)];
  }
  return;
}

Assistant:

void kwsysMD5_DigestToHex(unsigned char const digest[16], char buffer[32])
{
  /* Map from 4-bit index to hexadecimal representation.  */
  static char const hex[16] =
    {'0', '1', '2', '3', '4', '5', '6', '7',
     '8', '9', 'a', 'b', 'c', 'd', 'e', 'f'};

  /* Map each 4-bit block separately.  */
  char* out = buffer;
  int i;
  for(i=0; i < 16; ++i)
    {
    *out++ = hex[digest[i] >> 4];
    *out++ = hex[digest[i] & 0xF];
    }
}